

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::YAFluxRegister::CrseAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *flux,Real *dx,
          Real dt,RunOn runon)

{
  undefined8 uVar1;
  int *piVar2;
  const_reference ppFVar3;
  double *in_RCX;
  long lVar4;
  FabArray<amrex::FArrayBox> *in_RDI;
  double in_XMM0_Qa;
  Box tbx;
  Array4<const_double> fzarr;
  Array4<const_double> fyarr;
  Array4<const_double> fxarr;
  Array4<int> flag;
  Array4<double> fab;
  FArrayBox *fz;
  FArrayBox *fy;
  FArrayBox *fx;
  Real dtdz;
  Real dtdy;
  Real dtdx;
  int nc;
  Box *bx;
  int n_5;
  int n_4;
  int n_3;
  int n_2;
  int n_1;
  int n;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  size_type in_stack_fffffffffffff798;
  Array4<const_int> *this_00;
  MFIter *in_stack_fffffffffffff7a0;
  MFIter *mfi_00;
  Array4<const_int> local_848;
  undefined8 local_808;
  undefined4 in_stack_fffffffffffff800;
  int iVar5;
  undefined4 in_stack_fffffffffffff804;
  int iVar6;
  int iStack_7f8;
  int iStack_7f4;
  Array4<const_double> local_7e0;
  Array4<const_double> local_7a0;
  Array4<const_double> local_760;
  Array4<int> local_720;
  long local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  value_type local_6a0;
  value_type local_698;
  value_type local_690;
  double local_688;
  double local_680;
  double local_678;
  int local_670;
  undefined1 local_66c [40];
  undefined1 local_644 [4];
  double local_640;
  double *local_638;
  value_type local_618;
  value_type local_610;
  value_type local_608;
  undefined1 *local_600;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  Dim3 local_2d0;
  Dim3 local_2c0;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Box *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  Box *local_258;
  undefined4 local_24c;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_640 = in_XMM0_Qa;
  local_638 = in_RCX;
  MFIter::LocalIndex(in_stack_fffffffffffff7a0);
  piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7a0,
                      in_stack_fffffffffffff798);
  if (*piVar2 != 0) {
    mfi_00 = (MFIter *)local_66c;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    local_66c._28_8_ = mfi_00;
    local_670 = FabArrayBase::nComp(&in_RDI->super_FabArrayBase);
    local_678 = local_640 / *local_638;
    local_680 = local_640 / local_638[1];
    local_688 = local_640 / local_638[2];
    ppFVar3 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)mfi_00,in_stack_fffffffffffff798);
    local_690 = *ppFVar3;
    ppFVar3 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)mfi_00,in_stack_fffffffffffff798);
    local_698 = *ppFVar3;
    ppFVar3 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)mfi_00,in_stack_fffffffffffff798);
    local_6a0 = *ppFVar3;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)in_RDI,mfi_00);
    local_608 = local_690;
    local_288 = (local_690->super_BaseFab<double>).dptr;
    local_290 = &(local_690->super_BaseFab<double>).domain;
    local_294 = (local_690->super_BaseFab<double>).nvar;
    local_23c = 0;
    local_268 = (local_290->smallend).vect[0];
    local_24c = 1;
    iStack_264 = (local_690->super_BaseFab<double>).domain.smallend.vect[1];
    local_2b0.x = (local_290->smallend).vect[0];
    local_2b0.y = (local_290->smallend).vect[1];
    local_25c = 2;
    local_2b0.z = (local_690->super_BaseFab<double>).domain.smallend.vect[2];
    local_1e8 = &(local_690->super_BaseFab<double>).domain.bigend;
    local_1ec = 0;
    local_218 = local_1e8->vect[0] + 1;
    local_1f8 = &(local_690->super_BaseFab<double>).domain.bigend;
    local_1fc = 1;
    iStack_214 = (local_690->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_208 = &(local_690->super_BaseFab<double>).domain.bigend;
    local_20c = 2;
    local_2d0.z = (local_690->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_2d0.y = iStack_214;
    local_2d0.x = local_218;
    local_2c0._0_8_ = local_2d0._0_8_;
    local_2c0.z = local_2d0.z;
    local_2a0._0_8_ = local_2b0._0_8_;
    local_2a0.z = local_2b0.z;
    local_280._0_8_ = local_2b0._0_8_;
    local_280.z = local_2b0.z;
    local_270 = local_290;
    local_260 = local_2b0.z;
    local_258 = local_290;
    local_248 = local_290;
    local_238 = local_290;
    local_230._0_8_ = local_2d0._0_8_;
    local_230.z = local_2d0.z;
    local_220 = local_290;
    local_210 = local_2d0.z;
    Array4<const_double>::Array4(&local_760,local_288,&local_2a0,&local_2c0,local_294);
    local_610 = local_698;
    local_198 = (local_698->super_BaseFab<double>).dptr;
    local_1a0 = &(local_698->super_BaseFab<double>).domain;
    local_1a4 = (local_698->super_BaseFab<double>).nvar;
    local_14c = 0;
    local_178 = (local_1a0->smallend).vect[0];
    local_15c = 1;
    iStack_174 = (local_698->super_BaseFab<double>).domain.smallend.vect[1];
    local_1c0.x = (local_1a0->smallend).vect[0];
    local_1c0.y = (local_1a0->smallend).vect[1];
    local_16c = 2;
    local_1c0.z = (local_698->super_BaseFab<double>).domain.smallend.vect[2];
    local_f8 = &(local_698->super_BaseFab<double>).domain.bigend;
    local_fc = 0;
    local_128 = local_f8->vect[0] + 1;
    local_108 = &(local_698->super_BaseFab<double>).domain.bigend;
    local_10c = 1;
    iStack_124 = (local_698->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_118 = &(local_698->super_BaseFab<double>).domain.bigend;
    local_11c = 2;
    local_1e0.z = (local_698->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_1e0.y = iStack_124;
    local_1e0.x = local_128;
    local_1d0._0_8_ = local_1e0._0_8_;
    local_1d0.z = local_1e0.z;
    local_1b0._0_8_ = local_1c0._0_8_;
    local_1b0.z = local_1c0.z;
    local_190._0_8_ = local_1c0._0_8_;
    local_190.z = local_1c0.z;
    local_180 = local_1a0;
    local_170 = local_1c0.z;
    local_168 = local_1a0;
    local_158 = local_1a0;
    local_148 = local_1a0;
    local_140._0_8_ = local_1e0._0_8_;
    local_140.z = local_1e0.z;
    local_130 = local_1a0;
    local_120 = local_1e0.z;
    Array4<const_double>::Array4(&local_7a0,local_198,&local_1b0,&local_1d0,local_1a4);
    local_618 = local_6a0;
    local_a8 = (local_6a0->super_BaseFab<double>).dptr;
    local_b0 = &(local_6a0->super_BaseFab<double>).domain;
    local_b4 = (local_6a0->super_BaseFab<double>).nvar;
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = (local_6a0->super_BaseFab<double>).domain.smallend.vect[1];
    local_d0.x = (local_b0->smallend).vect[0];
    local_d0.y = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_d0.z = (local_6a0->super_BaseFab<double>).domain.smallend.vect[2];
    local_8 = &(local_6a0->super_BaseFab<double>).domain.bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(local_6a0->super_BaseFab<double>).domain.bigend;
    local_1c = 1;
    iStack_34 = (local_6a0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_28 = &(local_6a0->super_BaseFab<double>).domain.bigend;
    local_2c = 2;
    local_f0.z = (local_6a0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    Array4<const_double>::Array4(&local_7e0,local_a8,&local_c0,&local_dc,local_b4);
    local_600 = local_644;
    local_808 = (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                 local_66c._28_8_)->_M_t).
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    uVar1 = *(undefined8 *)(((IntVect *)(local_66c._28_8_ + 0x10))->vect + 1);
    iStack_7f8 = (int)((ulong)*(undefined8 *)((long)(local_66c._28_8_ + 8) + 4) >> 0x20);
    iVar5 = (int)*(FabArrayBase **)(local_66c._28_8_ + 8);
    iVar6 = (int)((ulong)*(FabArrayBase **)(local_66c._28_8_ + 8) >> 0x20);
    this_00 = &local_848;
    Array4<const_int>::Array4<const_int,_0>(this_00,&local_720);
    iStack_7f4 = (int)uVar1;
    for (local_5d4 = iVar5; local_5d8 = local_808._4_4_, local_5d4 <= iStack_7f4;
        local_5d4 = local_5d4 + 1) {
      for (; local_5dc = (int)local_808, local_5d8 <= iStack_7f8; local_5d8 = local_5d8 + 1) {
        for (; local_5dc <= iVar6; local_5dc = local_5dc + 1) {
          if (this_00->p
              [(long)(local_5dc - (this_00->begin).x) +
               (long)(local_5d8 - (this_00->begin).y) * this_00->jstride +
               (long)(local_5d4 - (this_00->begin).z) * this_00->kstride] == 1) {
            if (this_00->p
                [(long)((local_5dc + -1) - (this_00->begin).x) +
                 (long)(local_5d8 - (this_00->begin).y) * this_00->jstride +
                 (long)(local_5d4 - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5e0 = 0; local_5e0 < local_670; local_5e0 = local_5e0 + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5e0 * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     -local_678 *
                     local_760.p
                     [(long)(local_5dc - local_760.begin.x) +
                      (local_5d8 - local_760.begin.y) * local_760.jstride +
                      (local_5d4 - local_760.begin.z) * local_760.kstride +
                      local_5e0 * local_760.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
            if (this_00->p
                [(long)((local_5dc + 1) - (this_00->begin).x) +
                 (long)(local_5d8 - (this_00->begin).y) * this_00->jstride +
                 (long)(local_5d4 - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5e4 = 0; local_5e4 < local_670; local_5e4 = local_5e4 + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5e4 * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     local_678 *
                     local_760.p
                     [(long)((local_5dc + 1) - local_760.begin.x) +
                      (local_5d8 - local_760.begin.y) * local_760.jstride +
                      (local_5d4 - local_760.begin.z) * local_760.kstride +
                      local_5e4 * local_760.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
            if (this_00->p
                [(long)(local_5dc - (this_00->begin).x) +
                 (long)((local_5d8 + -1) - (this_00->begin).y) * this_00->jstride +
                 (long)(local_5d4 - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5e8 = 0; local_5e8 < local_670; local_5e8 = local_5e8 + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5e8 * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     -local_680 *
                     local_7a0.p
                     [(long)(local_5dc - local_7a0.begin.x) +
                      (local_5d8 - local_7a0.begin.y) * local_7a0.jstride +
                      (local_5d4 - local_7a0.begin.z) * local_7a0.kstride +
                      local_5e8 * local_7a0.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
            if (this_00->p
                [(long)(local_5dc - (this_00->begin).x) +
                 (long)((local_5d8 + 1) - (this_00->begin).y) * this_00->jstride +
                 (long)(local_5d4 - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5ec = 0; local_5ec < local_670; local_5ec = local_5ec + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5ec * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     local_680 *
                     local_7a0.p
                     [(long)(local_5dc - local_7a0.begin.x) +
                      ((local_5d8 + 1) - local_7a0.begin.y) * local_7a0.jstride +
                      (local_5d4 - local_7a0.begin.z) * local_7a0.kstride +
                      local_5ec * local_7a0.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
            if (this_00->p
                [(long)(local_5dc - (this_00->begin).x) +
                 (long)(local_5d8 - (this_00->begin).y) * this_00->jstride +
                 (long)((local_5d4 + -1) - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5f0 = 0; local_5f0 < local_670; local_5f0 = local_5f0 + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5f0 * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     -local_688 *
                     local_7e0.p
                     [(long)(local_5dc - local_7e0.begin.x) +
                      (local_5d8 - local_7e0.begin.y) * local_7e0.jstride +
                      (local_5d4 - local_7e0.begin.z) * local_7e0.kstride +
                      local_5f0 * local_7e0.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
            if (this_00->p
                [(long)(local_5dc - (this_00->begin).x) +
                 (long)(local_5d8 - (this_00->begin).y) * this_00->jstride +
                 (long)((local_5d4 + 1) - (this_00->begin).z) * this_00->kstride] == 2) {
              for (local_5f4 = 0; local_5f4 < local_670; local_5f4 = local_5f4 + 1) {
                lVar4 = (long)(local_5dc - local_6c0) + (local_5d8 - local_6bc) * local_6d8 +
                        (local_5d4 - local_6b8) * local_6d0 + local_5f4 * local_6c8;
                *(double *)(local_6e0 + lVar4 * 8) =
                     local_688 *
                     local_7e0.p
                     [(long)(local_5dc - local_7e0.begin.x) +
                      (local_5d8 - local_7e0.begin.y) * local_7e0.jstride +
                      ((local_5d4 + 1) - local_7e0.begin.z) * local_7e0.kstride +
                      local_5f4 * local_7e0.nstride] + *(double *)(local_6e0 + lVar4 * 8);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
YAFluxRegister::CrseAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_crse_data.nComp() == flux[0]->nComp());

    if (m_crse_fab_flag[mfi.LocalIndex()] == crse_cell) {
        return;  // this coarse fab is not close to fine fabs.
    }

    const Box& bx = mfi.tilebox();
    const int nc = m_crse_data.nComp();
    AMREX_D_TERM(const Real dtdx = dt/dx[0];,
                 const Real dtdy = dt/dx[1];,
                 const Real dtdz = dt/dx[2];);
    AMREX_D_TERM(FArrayBox const* fx = flux[0];,
                 FArrayBox const* fy = flux[1];,
                 FArrayBox const* fz = flux[2];);

    auto fab = m_crse_data.array(mfi);
    auto const flag = m_crse_flag.array(mfi);

    AMREX_D_TERM(Array4<Real const> fxarr = fx->const_array();,
                 Array4<Real const> fyarr = fy->const_array();,
                 Array4<Real const> fzarr = fz->const_array(););

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, bx, tbx,
    {
        yafluxreg_crseadd(tbx, fab, flag, AMREX_D_DECL(fxarr,fyarr,fzarr),
                          AMREX_D_DECL(dtdx,dtdy,dtdz),nc);
    });
}